

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  slot_type *psVar4;
  ctrl_t *pcVar5;
  byte bVar6;
  size_t i;
  size_t sVar7;
  undefined1 local_82;
  undefined1 local_81;
  slot_type *new_slots;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *set;
  anon_class_24_3_14f42436 insert_slot;
  HashSetResizeHelper resize_helper;
  
  set = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         *)common;
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<unsigned int>, absl::hash_internal::Hash<unsigned int>, std::equal_to<unsigned int>, std::allocator<unsigned int>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<unsigned int>, Hash = absl::hash_internal::Hash<unsigned int>, Eq = std::equal_to<unsigned int>, Alloc = std::allocator<unsigned int>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<unsigned int>, absl::hash_internal::Hash<unsigned int>, std::equal_to<unsigned int>, std::allocator<unsigned int>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<unsigned int>, Hash = absl::hash_internal::Hash<unsigned int>, Eq = std::equal_to<unsigned int>, Alloc = std::allocator<unsigned int>]"
                 );
  }
  bVar1 = is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)common);
  bVar6 = 0x80;
  if (bVar1) {
    bVar2 = empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)common);
    if (!bVar2) {
      psVar4 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)common);
      bVar6 = (byte)(((ulong)*psVar4 ^ (ulong)&hash_internal::MixingHashState::kSeed) *
                     0x5cb22ca68cb134ed >> 0x38) & 0x7f;
      bVar2 = true;
      goto LAB_007be98e;
    }
  }
  bVar2 = false;
LAB_007be98e:
  resize_helper.old_capacity_ = common->capacity_;
  resize_helper.had_infoz_ = (bool)((byte)common->size_ & 1);
  resize_helper.old_heap_or_soo_.heap.control = (common->heap_or_soo_).heap.control;
  resize_helper.old_heap_or_soo_.heap.slot_array = (common->heap_or_soo_).heap.slot_array;
  resize_helper.was_soo_ = bVar1;
  resize_helper.had_soo_slot_ = bVar2;
  CommonFields::set_capacity(common,new_capacity);
  bVar3 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,4ul,true,true,4ul>
                    (&resize_helper,common,&local_81,(int)(char)bVar6,4,4);
  if (resize_helper.old_capacity_ != 0) {
    if ((bVar2 | !bVar1) == 1) {
      new_slots = slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)common);
      if (!bVar3) {
        insert_slot.set = &set;
        insert_slot.new_slots = &new_slots;
        insert_slot.common = common;
        if (bVar1) {
          resize_impl::anon_class_24_3_14f42436::operator()
                    (&insert_slot,(slot_type *)&resize_helper);
        }
        else {
          psVar4 = (slot_type *)HashSetResizeHelper::old_slots(&resize_helper);
          for (sVar7 = 0; sVar7 != resize_helper.old_capacity_; sVar7 = sVar7 + 1) {
            pcVar5 = HashSetResizeHelper::old_ctrl(&resize_helper);
            if (kSentinel < pcVar5[sVar7]) {
              resize_impl::anon_class_24_3_14f42436::operator()(&insert_slot,psVar4);
            }
            psVar4 = psVar4 + 1;
          }
          CommonFields::infoz(common);
          HashSetResizeHelper::DeallocateOld<4ul,std::allocator<char>>(&resize_helper,&local_82,4);
        }
      }
    }
    return;
  }
  __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xeb6,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<unsigned int>, absl::hash_internal::Hash<unsigned int>, std::equal_to<unsigned int>, std::allocator<unsigned int>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<unsigned int>, Hash = absl::hash_internal::Hash<unsigned int>, Eq = std::equal_to<unsigned int>, Alloc = std::allocator<unsigned int>]"
               );
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE static void resize_impl(
      CommonFields& common, size_t new_capacity,
      HashtablezInfoHandle forced_infoz) {
    raw_hash_set* set = reinterpret_cast<raw_hash_set*>(&common);
    ABSL_SWISSTABLE_ASSERT(IsValidCapacity(new_capacity));
    ABSL_SWISSTABLE_ASSERT(!set->fits_in_soo(new_capacity));
    const bool was_soo = set->is_soo();
    const bool had_soo_slot = was_soo && !set->empty();
    const ctrl_t soo_slot_h2 =
        had_soo_slot ? static_cast<ctrl_t>(H2(set->hash_of(set->soo_slot())))
                     : ctrl_t::kEmpty;
    HashSetResizeHelper resize_helper(common, was_soo, had_soo_slot,
                                      forced_infoz);
    // Initialize HashSetResizeHelper::old_heap_or_soo_. We can't do this in
    // HashSetResizeHelper constructor because it can't transfer slots when
    // transfer_uses_memcpy is false.
    // TODO(b/289225379): try to handle more of the SOO cases inside
    // InitializeSlots. See comment on cl/555990034 snapshot #63.
    if (PolicyTraits::transfer_uses_memcpy() || !had_soo_slot) {
      resize_helper.old_heap_or_soo() = common.heap_or_soo();
    } else {
      set->transfer(set->to_slot(resize_helper.old_soo_data()),
                    set->soo_slot());
    }
    common.set_capacity(new_capacity);
    // Note that `InitializeSlots` does different number initialization steps
    // depending on the values of `transfer_uses_memcpy` and capacities.
    // Refer to the comment in `InitializeSlots` for more details.
    const bool grow_single_group =
        resize_helper.InitializeSlots<CharAlloc, sizeof(slot_type),
                                      PolicyTraits::transfer_uses_memcpy(),
                                      SooEnabled(), alignof(slot_type)>(
            common, CharAlloc(set->alloc_ref()), soo_slot_h2, sizeof(key_type),
            sizeof(value_type));

    // In the SooEnabled() case, capacity is never 0 so we don't check.
    if (!SooEnabled() && resize_helper.old_capacity() == 0) {
      // InitializeSlots did all the work including infoz().RecordRehash().
      return;
    }
    ABSL_SWISSTABLE_ASSERT(resize_helper.old_capacity() > 0);
    // Nothing more to do in this case.
    if (was_soo && !had_soo_slot) return;

    slot_type* new_slots = set->slot_array();
    if (grow_single_group) {
      if (PolicyTraits::transfer_uses_memcpy()) {
        // InitializeSlots did all the work.
        return;
      }
      if (was_soo) {
        set->transfer(new_slots + resize_helper.SooSlotIndex(),
                      to_slot(resize_helper.old_soo_data()));
        return;
      } else {
        // We want GrowSizeIntoSingleGroup to be called here in order to make
        // InitializeSlots not depend on PolicyTraits.
        resize_helper.GrowSizeIntoSingleGroup<PolicyTraits>(common,
                                                            set->alloc_ref());
      }
    } else {
      // InitializeSlots prepares control bytes to correspond to empty table.
      const auto insert_slot = [&](slot_type* slot) {
        size_t hash = PolicyTraits::apply(HashElement{set->hash_ref()},
                                          PolicyTraits::element(slot));
        auto target = find_first_non_full(common, hash);
        SetCtrl(common, target.offset, H2(hash), sizeof(slot_type));
        set->transfer(new_slots + target.offset, slot);
        return target.probe_length;
      };
      if (was_soo) {
        insert_slot(to_slot(resize_helper.old_soo_data()));
        return;
      } else {
        auto* old_slots = static_cast<slot_type*>(resize_helper.old_slots());
        size_t total_probe_length = 0;
        for (size_t i = 0; i != resize_helper.old_capacity(); ++i) {
          if (IsFull(resize_helper.old_ctrl()[i])) {
            total_probe_length += insert_slot(old_slots + i);
          }
        }
        common.infoz().RecordRehash(total_probe_length);
      }
    }
    resize_helper.DeallocateOld<alignof(slot_type)>(CharAlloc(set->alloc_ref()),
                                                    sizeof(slot_type));
  }